

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysql.hpp
# Opt level: O1

int __thiscall shine::db::mysql::open(mysql *this,char *__file,int __oflag,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  my_bool mVar3;
  int iVar4;
  MYSQL *pMVar5;
  char *pcVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  pointer pcVar9;
  undefined8 unaff_R14;
  uint32 *puVar10;
  my_bool reconnect;
  address_info_t addr;
  
  if (this->_conn != (MYSQL_t)0x0) {
    return (int)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  }
  puVar10 = (uint32 *)0x0;
  pMVar5 = (*mysql_init_func)((MYSQL *)0x0);
  this->_conn = pMVar5;
  if (pMVar5 == (MYSQL *)0x0) {
    return 0;
  }
  paVar1 = &addr._ip.super_string.field_2;
  addr._ip.super_string._M_string_length = 0;
  addr._ip.super_string.field_2._M_local_buf[0] = '\0';
  addr._v6 = false;
  addr._ip.super_string._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = net::socket::parse_addr((string *)this,&addr);
  if ((this->_connect_info)._conn_timeout != 0) {
    (*mysql_options_func)
              (this->_conn,MYSQL_OPT_CONNECT_TIMEOUT,&(this->_connect_info)._conn_timeout);
  }
  if ((this->_connect_info)._rw_timeout != 0) {
    puVar10 = &(this->_connect_info)._rw_timeout;
    (*mysql_options_func)(this->_conn,MYSQL_OPT_READ_TIMEOUT,puVar10);
    (*mysql_options_func)(this->_conn,MYSQL_OPT_WRITE_TIMEOUT,puVar10);
  }
  reconnect = '\x01';
  (*mysql_options_func)(this->_conn,MYSQL_OPT_RECONNECT,&reconnect);
  _Var7 = addr._ip.super_string._M_dataplus;
  if (!bVar2) {
    _Var7._M_p = (char *)0x0;
  }
  uVar8 = (uint)addr._port;
  if (!bVar2) {
    uVar8 = 0;
  }
  pcVar9 = (this->_connect_info)._addr.super_string._M_dataplus._M_p;
  if (bVar2) {
    pcVar9 = (char *)0x0;
  }
  pMVar5 = (*mysql_real_connect_func)
                     (this->_conn,_Var7._M_p,
                      (this->_connect_info)._user.super_string._M_dataplus._M_p,
                      (this->_connect_info)._password.super_string._M_dataplus._M_p,
                      (this->_connect_info)._database.super_string._M_dataplus._M_p,uVar8,pcVar9,
                      (this->_connect_info)._flags);
  if (pMVar5 != (MYSQL *)0x0) {
    if (((this->_connect_info)._charset.super_string._M_string_length != 0) &&
       (iVar4 = (*mysql_set_character_set_func)
                          (this->_conn,(this->_connect_info)._charset.super_string._M_dataplus._M_p)
       , iVar4 != 0)) {
      puVar10 = (uint32 *)(this->_connect_info)._charset.super_string._M_dataplus._M_p;
      pcVar6 = (*mysql_error_func)(this->_conn);
      printf("set mysql to %s error %s",puVar10,pcVar6);
    }
    mVar3 = (*mysql_autocommit_func)(this->_conn,(this->_connect_info)._auto_commit);
    if (mVar3 == '\0') {
      iVar4 = (int)CONCAT71((int7)((ulong)puVar10 >> 8),1);
      goto LAB_001578b8;
    }
  }
  (*mysql_close_func)(this->_conn);
  this->_conn = (MYSQL_t)0x0;
  iVar4 = 0;
LAB_001578b8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)addr._ip.super_string._M_dataplus._M_p != paVar1) {
    operator_delete(addr._ip.super_string._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

bool open() {
                if (get_conn() != NULL)
                    return true;

                if (get_conn() == NULL) {
                    get_conn() = mysql_init_func(NULL);
                    if (get_conn() == NULL)
                        return false;
                }

                net::address_info_t addr;
                bool unix_socket = !net::socket::parse_addr(get_connect_info().get_addr(), addr);

                if (get_connect_info().get_conn_timeout() > 0)
                    mysql_options_func(get_conn(), MYSQL_OPT_CONNECT_TIMEOUT,
                                       (const void *) &get_connect_info().get_conn_timeout());

                if (get_connect_info().get_rw_timeout() > 0) {
                    mysql_options_func(get_conn(), MYSQL_OPT_READ_TIMEOUT,
                                       (const void *) &get_connect_info().get_rw_timeout());
                    mysql_options_func(get_conn(), MYSQL_OPT_WRITE_TIMEOUT,
                                       (const void *) &get_connect_info().get_rw_timeout());
                }

                my_bool reconnect = 1;

                mysql_options_func(get_conn(), MYSQL_OPT_RECONNECT, (const void *) &reconnect);

                if (mysql_real_connect_func(get_conn(),
                                            unix_socket ? NULL : addr.get_ip().c_str(),
                                            get_connect_info().get_user().c_str(),
                                            get_connect_info().get_password().c_str(),
                                            get_connect_info().get_database().c_str(),
                                            unix_socket ? 0 : addr.get_port(),
                                            unix_socket ? get_connect_info().get_addr().c_str() : NULL,
                                            get_connect_info().get_flags()) == NULL) {
                    mysql_close_func(get_conn());
                    get_conn() = NULL;
                    return false;
                }

                if (!get_connect_info().get_charset().empty()) {
                    if (mysql_set_character_set_func(get_conn(), get_connect_info().get_charset().c_str()))
                        printf("set mysql to %s error %s", get_connect_info().get_charset().c_str(),
                               mysql_error_func(get_conn()));
                }

#if MYSQL_VERSION_ID >= 50000
                if (mysql_autocommit_func(get_conn(), get_connect_info().get_auto_commit() ? 1 : 0) != 0) {
                    mysql_close_func(get_conn());
                    get_conn() = NULL;
                    return (false);
                }
#else
                get_connect_info().get_auto_commit() = false;
#endif

                return true;
            }